

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O0

GLFWgammaramp * glfwGetGammaRamp(GLFWmonitor *handle)

{
  long in_RDI;
  _GLFWmonitor *monitor;
  GLFWgammaramp *in_stack_fffffffffffffff8;
  GLFWgammaramp *pGVar1;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    pGVar1 = (GLFWgammaramp *)0x0;
  }
  else {
    _glfwFreeGammaArrays((GLFWgammaramp *)0x1e3f96);
    _glfwPlatformGetGammaRamp(monitor,in_stack_fffffffffffffff8);
    pGVar1 = (GLFWgammaramp *)(in_RDI + 0x68);
  }
  return pGVar1;
}

Assistant:

GLFWAPI const GLFWgammaramp* glfwGetGammaRamp(GLFWmonitor* handle)
{
    _GLFWmonitor* monitor = (_GLFWmonitor*) handle;
    assert(monitor != NULL);

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    _glfwFreeGammaArrays(&monitor->currentRamp);
    _glfwPlatformGetGammaRamp(monitor, &monitor->currentRamp);

    return &monitor->currentRamp;
}